

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec3fa.h
# Opt level: O3

int __thiscall
embree::BSplinePatchT<embree::Vec3fa,_embree::Vec3fa>::init
          (BSplinePatchT<embree::Vec3fa,_embree::Vec3fa> *this,EVP_PKEY_CTX *ctx)

{
  float *pfVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  ulong uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  
  fVar16 = *(float *)(ctx + 0xd0);
  fVar17 = *(float *)(ctx + 0xd4);
  fVar18 = *(float *)(ctx + 0xd8);
  fVar19 = *(float *)(ctx + 0xdc);
  this->v[1][1].field_0.m128[0] = fVar16;
  this->v[1][1].field_0.m128[1] = fVar17;
  this->v[1][1].field_0.m128[2] = fVar18;
  this->v[1][1].field_0.m128[3] = fVar19;
  fVar3 = *(float *)(ctx + 0x410);
  fVar4 = *(float *)(ctx + 0x414);
  fVar5 = *(float *)(ctx + 0x418);
  fVar6 = *(float *)(ctx + 0x41c);
  this->v[1][2].field_0.m128[0] = fVar3;
  this->v[1][2].field_0.m128[1] = fVar4;
  this->v[1][2].field_0.m128[2] = fVar5;
  this->v[1][2].field_0.m128[3] = fVar6;
  fVar7 = *(float *)(ctx + 0x750);
  fVar8 = *(float *)(ctx + 0x754);
  fVar9 = *(float *)(ctx + 0x758);
  fVar10 = *(float *)(ctx + 0x75c);
  this->v[2][2].field_0.m128[0] = fVar7;
  this->v[2][2].field_0.m128[1] = fVar8;
  this->v[2][2].field_0.m128[2] = fVar9;
  this->v[2][2].field_0.m128[3] = fVar10;
  fVar11 = *(float *)(ctx + 0xa90);
  fVar12 = *(float *)(ctx + 0xa94);
  fVar13 = *(float *)(ctx + 0xa98);
  fVar14 = *(float *)(ctx + 0xa9c);
  this->v[2][1].field_0.m128[0] = fVar11;
  this->v[2][1].field_0.m128[1] = fVar12;
  this->v[2][1].field_0.m128[2] = fVar13;
  this->v[2][1].field_0.m128[3] = fVar14;
  if ((ulong)*(uint *)(ctx + 8) - 2 == (long)*(int *)ctx) {
    fVar36 = (fVar16 + fVar16) - fVar11;
    fVar37 = (fVar17 + fVar17) - fVar12;
    fVar38 = (fVar18 + fVar18) - fVar13;
    fVar39 = (fVar19 + fVar19) - fVar14;
    this->v[0][1].field_0.m128[0] = fVar36;
    this->v[0][1].field_0.m128[1] = fVar37;
    this->v[0][1].field_0.m128[2] = fVar38;
    this->v[0][1].field_0.m128[3] = fVar39;
    fVar48 = (fVar3 + fVar3) - fVar7;
    fVar49 = (fVar4 + fVar4) - fVar8;
    fVar50 = (fVar5 + fVar5) - fVar9;
    fVar51 = (fVar6 + fVar6) - fVar10;
  }
  else {
    pfVar1 = (float *)(*(long *)(ctx + 0x300) + -0x20 + (ulong)*(uint *)(ctx + 8) * 0x10);
    fVar36 = *pfVar1;
    fVar37 = pfVar1[1];
    fVar38 = pfVar1[2];
    fVar39 = pfVar1[3];
    this->v[0][1].field_0.m128[0] = fVar36;
    this->v[0][1].field_0.m128[1] = fVar37;
    this->v[0][1].field_0.m128[2] = fVar38;
    this->v[0][1].field_0.m128[3] = fVar39;
    pfVar1 = (float *)(*(long *)(ctx + 0x300) + -0x10 + (ulong)*(uint *)(ctx + 8) * 0x10);
    fVar48 = *pfVar1;
    fVar49 = pfVar1[1];
    fVar50 = pfVar1[2];
    fVar51 = pfVar1[3];
  }
  this->v[0][2].field_0.m128[0] = fVar48;
  this->v[0][2].field_0.m128[1] = fVar49;
  this->v[0][2].field_0.m128[2] = fVar50;
  this->v[0][2].field_0.m128[3] = fVar51;
  if ((ulong)*(uint *)(ctx + 0x348) - 2 == (long)*(int *)(ctx + 0x340)) {
    fVar29 = (fVar3 + fVar3) - fVar16;
    fVar31 = (fVar4 + fVar4) - fVar17;
    fVar33 = (fVar5 + fVar5) - fVar18;
    fVar35 = (fVar6 + fVar6) - fVar19;
    this->v[1][3].field_0.m128[0] = fVar29;
    this->v[1][3].field_0.m128[1] = fVar31;
    this->v[1][3].field_0.m128[2] = fVar33;
    this->v[1][3].field_0.m128[3] = fVar35;
    fVar28 = (fVar7 + fVar7) - fVar11;
    fVar30 = (fVar8 + fVar8) - fVar12;
    fVar32 = (fVar9 + fVar9) - fVar13;
    fVar34 = (fVar10 + fVar10) - fVar14;
  }
  else {
    pfVar1 = (float *)(*(long *)(ctx + 0x640) + -0x20 + (ulong)*(uint *)(ctx + 0x348) * 0x10);
    fVar29 = *pfVar1;
    fVar31 = pfVar1[1];
    fVar33 = pfVar1[2];
    fVar35 = pfVar1[3];
    this->v[1][3].field_0.m128[0] = fVar29;
    this->v[1][3].field_0.m128[1] = fVar31;
    this->v[1][3].field_0.m128[2] = fVar33;
    this->v[1][3].field_0.m128[3] = fVar35;
    pfVar1 = (float *)(*(long *)(ctx + 0x640) + -0x10 + (ulong)*(uint *)(ctx + 0x348) * 0x10);
    fVar28 = *pfVar1;
    fVar30 = pfVar1[1];
    fVar32 = pfVar1[2];
    fVar34 = pfVar1[3];
  }
  this->v[2][3].field_0.m128[0] = fVar28;
  this->v[2][3].field_0.m128[1] = fVar30;
  this->v[2][3].field_0.m128[2] = fVar32;
  this->v[2][3].field_0.m128[3] = fVar34;
  if ((ulong)*(uint *)(ctx + 0x688) - 2 == (long)*(int *)(ctx + 0x680)) {
    fVar20 = (fVar7 + fVar7) - fVar3;
    fVar21 = (fVar8 + fVar8) - fVar4;
    fVar22 = (fVar9 + fVar9) - fVar5;
    fVar23 = (fVar10 + fVar10) - fVar6;
    this->v[3][2].field_0.m128[0] = fVar20;
    this->v[3][2].field_0.m128[1] = fVar21;
    this->v[3][2].field_0.m128[2] = fVar22;
    this->v[3][2].field_0.m128[3] = fVar23;
    fVar24 = (fVar11 + fVar11) - fVar16;
    fVar25 = (fVar12 + fVar12) - fVar17;
    fVar26 = (fVar13 + fVar13) - fVar18;
    fVar27 = (fVar14 + fVar14) - fVar19;
  }
  else {
    pfVar1 = (float *)(*(long *)(ctx + 0x980) + -0x20 + (ulong)*(uint *)(ctx + 0x688) * 0x10);
    fVar20 = *pfVar1;
    fVar21 = pfVar1[1];
    fVar22 = pfVar1[2];
    fVar23 = pfVar1[3];
    this->v[3][2].field_0.m128[0] = fVar20;
    this->v[3][2].field_0.m128[1] = fVar21;
    this->v[3][2].field_0.m128[2] = fVar22;
    this->v[3][2].field_0.m128[3] = fVar23;
    pfVar1 = (float *)(*(long *)(ctx + 0x980) + -0x10 + (ulong)*(uint *)(ctx + 0x688) * 0x10);
    fVar24 = *pfVar1;
    fVar25 = pfVar1[1];
    fVar26 = pfVar1[2];
    fVar27 = pfVar1[3];
  }
  this->v[3][1].field_0.m128[0] = fVar24;
  this->v[3][1].field_0.m128[1] = fVar25;
  this->v[3][1].field_0.m128[2] = fVar26;
  this->v[3][1].field_0.m128[3] = fVar27;
  if ((ulong)*(uint *)(ctx + 0x9c8) - 2 == (long)*(int *)(ctx + 0x9c0)) {
    fVar40 = (fVar11 + fVar11) - fVar7;
    fVar42 = (fVar12 + fVar12) - fVar8;
    fVar44 = (fVar13 + fVar13) - fVar9;
    fVar46 = (fVar14 + fVar14) - fVar10;
    this->v[2][0].field_0.m128[0] = fVar40;
    this->v[2][0].field_0.m128[1] = fVar42;
    this->v[2][0].field_0.m128[2] = fVar44;
    this->v[2][0].field_0.m128[3] = fVar46;
    fVar41 = (fVar16 + fVar16) - fVar3;
    fVar43 = (fVar17 + fVar17) - fVar4;
    fVar45 = (fVar18 + fVar18) - fVar5;
    fVar47 = (fVar19 + fVar19) - fVar6;
  }
  else {
    pfVar1 = (float *)(*(long *)(ctx + 0xcc0) + -0x20 + (ulong)*(uint *)(ctx + 0x9c8) * 0x10);
    fVar40 = *pfVar1;
    fVar42 = pfVar1[1];
    fVar44 = pfVar1[2];
    fVar46 = pfVar1[3];
    this->v[2][0].field_0.m128[0] = fVar40;
    this->v[2][0].field_0.m128[1] = fVar42;
    this->v[2][0].field_0.m128[2] = fVar44;
    this->v[2][0].field_0.m128[3] = fVar46;
    pfVar1 = (float *)(*(long *)(ctx + 0xcc0) + -0x10 + (ulong)*(uint *)(ctx + 0x9c8) * 0x10);
    fVar41 = *pfVar1;
    fVar43 = pfVar1[1];
    fVar45 = pfVar1[2];
    fVar47 = pfVar1[3];
  }
  this->v[1][0].field_0.m128[0] = fVar41;
  this->v[1][0].field_0.m128[1] = fVar43;
  this->v[1][0].field_0.m128[2] = fVar45;
  this->v[1][0].field_0.m128[3] = fVar47;
  iVar2 = *(int *)ctx;
  if ((ulong)*(uint *)(ctx + 8) - 2 == (long)iVar2) {
    if (iVar2 == 2) {
      fVar52 = fVar3 + fVar11;
      fVar53 = fVar4 + fVar12;
      fVar54 = fVar5 + fVar13;
      fVar55 = fVar6 + fVar14;
      if ((*(uint *)(ctx + 0xc) & 0x7fffffff) == 0x7f800000) {
        fVar52 = fVar16 * 4.0 - (fVar52 + fVar52);
        fVar53 = fVar17 * 4.0 - (fVar53 + fVar53);
        fVar54 = fVar18 * 4.0 - (fVar54 + fVar54);
        fVar55 = fVar19 * 4.0 - (fVar55 + fVar55);
      }
      else {
        fVar52 = fVar52 * 4.0 + fVar16 * -8.0;
        fVar53 = fVar53 * 4.0 + fVar17 * -8.0;
        fVar54 = fVar54 * 4.0 + fVar18 * -8.0;
        fVar55 = fVar55 * 4.0 + fVar19 * -8.0;
      }
      fVar52 = fVar52 + fVar7;
      fVar53 = fVar53 + fVar8;
      fVar54 = fVar54 + fVar9;
      fVar55 = fVar55 + fVar10;
    }
    else {
      fVar52 = (fVar41 + fVar41) - fVar40;
      fVar53 = (fVar43 + fVar43) - fVar42;
      fVar54 = (fVar45 + fVar45) - fVar44;
      fVar55 = (fVar47 + fVar47) - fVar46;
    }
  }
  else if (iVar2 == 2) {
    fVar52 = (fVar36 + fVar36) - fVar48;
    fVar53 = (fVar37 + fVar37) - fVar49;
    fVar54 = (fVar38 + fVar38) - fVar50;
    fVar55 = (fVar39 + fVar39) - fVar51;
  }
  else {
    pfVar1 = (float *)(*(long *)(ctx + 0x300) + -0x30 + (ulong)*(uint *)(ctx + 8) * 0x10);
    fVar52 = *pfVar1;
    fVar53 = pfVar1[1];
    fVar54 = pfVar1[2];
    fVar55 = pfVar1[3];
  }
  this->v[0][0].field_0.m128[0] = fVar52;
  this->v[0][0].field_0.m128[1] = fVar53;
  this->v[0][0].field_0.m128[2] = fVar54;
  this->v[0][0].field_0.m128[3] = fVar55;
  iVar2 = *(int *)(ctx + 0x340);
  if ((ulong)*(uint *)(ctx + 0x348) - 2 == (long)iVar2) {
    if (iVar2 == 2) {
      fVar36 = fVar16 + fVar7;
      fVar37 = fVar17 + fVar8;
      fVar38 = fVar18 + fVar9;
      fVar39 = fVar19 + fVar10;
      if ((*(uint *)(ctx + 0x34c) & 0x7fffffff) == 0x7f800000) {
        fVar36 = fVar3 * 4.0 - (fVar36 + fVar36);
        fVar37 = fVar4 * 4.0 - (fVar37 + fVar37);
        fVar38 = fVar5 * 4.0 - (fVar38 + fVar38);
        fVar39 = fVar6 * 4.0 - (fVar39 + fVar39);
      }
      else {
        fVar36 = fVar36 * 4.0 + fVar3 * -8.0;
        fVar37 = fVar37 * 4.0 + fVar4 * -8.0;
        fVar38 = fVar38 * 4.0 + fVar5 * -8.0;
        fVar39 = fVar39 * 4.0 + fVar6 * -8.0;
      }
      fVar36 = fVar36 + fVar11;
      fVar37 = fVar37 + fVar12;
      fVar38 = fVar38 + fVar13;
      fVar39 = fVar39 + fVar14;
    }
    else {
      fVar36 = (fVar48 + fVar48) - fVar36;
      fVar37 = (fVar49 + fVar49) - fVar37;
      fVar38 = (fVar50 + fVar50) - fVar38;
      fVar39 = (fVar51 + fVar51) - fVar39;
    }
  }
  else if (iVar2 == 2) {
    fVar36 = (fVar29 + fVar29) - fVar28;
    fVar37 = (fVar31 + fVar31) - fVar30;
    fVar38 = (fVar33 + fVar33) - fVar32;
    fVar39 = (fVar35 + fVar35) - fVar34;
  }
  else {
    pfVar1 = (float *)(*(long *)(ctx + 0x640) + -0x30 + (ulong)*(uint *)(ctx + 0x348) * 0x10);
    fVar36 = *pfVar1;
    fVar37 = pfVar1[1];
    fVar38 = pfVar1[2];
    fVar39 = pfVar1[3];
  }
  this->v[0][3].field_0.m128[0] = fVar36;
  this->v[0][3].field_0.m128[1] = fVar37;
  this->v[0][3].field_0.m128[2] = fVar38;
  this->v[0][3].field_0.m128[3] = fVar39;
  iVar2 = *(int *)(ctx + 0x680);
  if ((ulong)*(uint *)(ctx + 0x688) - 2 == (long)iVar2) {
    if (iVar2 == 2) {
      fVar36 = fVar3 + fVar11;
      fVar37 = fVar4 + fVar12;
      fVar38 = fVar5 + fVar13;
      fVar39 = fVar6 + fVar14;
      if ((*(uint *)(ctx + 0x68c) & 0x7fffffff) == 0x7f800000) {
        fVar29 = fVar7 * 4.0 - (fVar36 + fVar36);
        fVar31 = fVar8 * 4.0 - (fVar37 + fVar37);
        fVar33 = fVar9 * 4.0 - (fVar38 + fVar38);
        fVar35 = fVar10 * 4.0 - (fVar39 + fVar39);
      }
      else {
        fVar29 = fVar36 * 4.0 + fVar7 * -8.0;
        fVar31 = fVar37 * 4.0 + fVar8 * -8.0;
        fVar33 = fVar38 * 4.0 + fVar9 * -8.0;
        fVar35 = fVar39 * 4.0 + fVar10 * -8.0;
      }
      fVar29 = fVar29 + fVar16;
      fVar31 = fVar31 + fVar17;
      fVar33 = fVar33 + fVar18;
      fVar35 = fVar35 + fVar19;
    }
    else {
      fVar29 = (fVar28 + fVar28) - fVar29;
      fVar31 = (fVar30 + fVar30) - fVar31;
      fVar33 = (fVar32 + fVar32) - fVar33;
      fVar35 = (fVar34 + fVar34) - fVar35;
    }
  }
  else if (iVar2 == 2) {
    fVar29 = (fVar20 + fVar20) - fVar24;
    fVar31 = (fVar21 + fVar21) - fVar25;
    fVar33 = (fVar22 + fVar22) - fVar26;
    fVar35 = (fVar23 + fVar23) - fVar27;
  }
  else {
    pfVar1 = (float *)(*(long *)(ctx + 0x980) + -0x30 + (ulong)*(uint *)(ctx + 0x688) * 0x10);
    fVar29 = *pfVar1;
    fVar31 = pfVar1[1];
    fVar33 = pfVar1[2];
    fVar35 = pfVar1[3];
  }
  this->v[3][3].field_0.m128[0] = fVar29;
  this->v[3][3].field_0.m128[1] = fVar31;
  this->v[3][3].field_0.m128[2] = fVar33;
  this->v[3][3].field_0.m128[3] = fVar35;
  iVar2 = *(int *)(ctx + 0x9c0);
  uVar15 = (ulong)*(uint *)(ctx + 0x9c8);
  if (uVar15 - 2 == (long)iVar2) {
    if (iVar2 == 2) {
      uVar15 = (ulong)(*(uint *)(ctx + 0x9cc) & 0x7fffffff);
      fVar16 = fVar16 + fVar7;
      fVar17 = fVar17 + fVar8;
      fVar18 = fVar18 + fVar9;
      fVar19 = fVar19 + fVar10;
      if ((*(uint *)(ctx + 0x9cc) & 0x7fffffff) == 0x7f800000) {
        fVar41 = fVar11 * 4.0 - (fVar16 + fVar16);
        fVar43 = fVar12 * 4.0 - (fVar17 + fVar17);
        fVar45 = fVar13 * 4.0 - (fVar18 + fVar18);
        fVar47 = fVar14 * 4.0 - (fVar19 + fVar19);
      }
      else {
        fVar41 = fVar11 * -8.0 + fVar16 * 4.0;
        fVar43 = fVar12 * -8.0 + fVar17 * 4.0;
        fVar45 = fVar13 * -8.0 + fVar18 * 4.0;
        fVar47 = fVar14 * -8.0 + fVar19 * 4.0;
      }
      fVar41 = fVar3 + fVar41;
      fVar43 = fVar4 + fVar43;
      fVar45 = fVar5 + fVar45;
      fVar47 = fVar6 + fVar47;
    }
    else {
      fVar41 = (fVar24 + fVar24) - fVar20;
      fVar43 = (fVar25 + fVar25) - fVar21;
      fVar45 = (fVar26 + fVar26) - fVar22;
      fVar47 = (fVar27 + fVar27) - fVar23;
    }
  }
  else if (iVar2 == 2) {
    fVar41 = (fVar40 + fVar40) - fVar41;
    fVar43 = (fVar42 + fVar42) - fVar43;
    fVar45 = (fVar44 + fVar44) - fVar45;
    fVar47 = (fVar46 + fVar46) - fVar47;
  }
  else {
    uVar15 = uVar15 * 0x10;
    pfVar1 = (float *)(*(long *)(ctx + 0xcc0) + -0x30 + uVar15);
    fVar41 = *pfVar1;
    fVar43 = pfVar1[1];
    fVar45 = pfVar1[2];
    fVar47 = pfVar1[3];
  }
  this->v[3][0].field_0.m128[0] = fVar41;
  this->v[3][0].field_0.m128[1] = fVar43;
  this->v[3][0].field_0.m128[2] = fVar45;
  this->v[3][0].field_0.m128[3] = fVar47;
  return (int)uVar15;
}

Assistant:

__forceinline Vec3fa& operator =( const Vec3fa& other ) { m128 = other.m128; return *this; }